

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_pattern_mbs(archive_match *a,match_list *list,char *pattern)

{
  match *m;
  size_t local_38;
  size_t len;
  match *match;
  char *pattern_local;
  match_list *list_local;
  archive_match *a_local;
  
  m = (match *)calloc(1,0x78);
  if (m == (match *)0x0) {
    a_local._4_4_ = error_nomem(a);
  }
  else {
    local_38 = strlen(pattern);
    if ((local_38 != 0) && (pattern[local_38 - 1] == '/')) {
      local_38 = local_38 - 1;
    }
    archive_mstring_copy_mbs_len(&m->pattern,pattern,local_38);
    match_list_add(list,m);
    a->setflag = a->setflag | 1;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
add_pattern_mbs(struct archive_match *a, struct match_list *list,
    const char *pattern)
{
	struct match *match;
	size_t len;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	/* Both "foo/" and "foo" should match "foo/bar". */
	len = strlen(pattern);
	if (len && pattern[len - 1] == '/')
		--len;
	archive_mstring_copy_mbs_len(&(match->pattern), pattern, len);
	match_list_add(list, match);
	a->setflag |= PATTERN_IS_SET;
	return (ARCHIVE_OK);
}